

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O1

void mul(int64_t *o,int64_t *a,int64_t *b)

{
  long lVar1;
  size_t i_1;
  size_t j;
  long lVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  size_t i;
  long lVar5;
  byte bVar6;
  int64_t t [31];
  int64_t local_128 [16];
  long alStack_a8 [16];
  
  bVar6 = 0;
  piVar4 = local_128;
  lVar5 = 0;
  memset(local_128,0,0xf8);
  do {
    lVar1 = a[lVar5];
    lVar2 = 0;
    do {
      *(long *)((long)piVar4 + lVar2 * 8) = *(long *)((long)piVar4 + lVar2 * 8) + b[lVar2] * lVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    lVar5 = lVar5 + 1;
    piVar4 = (int64_t *)((long)piVar4 + 8);
  } while (lVar5 != 0x10);
  lVar5 = 0;
  do {
    local_128[lVar5] = local_128[lVar5] + alStack_a8[lVar5] * 0x26;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xf);
  piVar4 = local_128;
  piVar3 = o;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *piVar3 = *piVar4;
    piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar6 * -2 + 1;
  }
  car25519(o);
  car25519(o);
  return;
}

Assistant:

static void mul(gf o, const gf a, const gf b)
{
  int64_t t[31];

  for (size_t i = 0; i < 31; i++)
    t[i] = 0;

  for (size_t i = 0; i < 16; i++)
    for (size_t j = 0; j < 16; j++)
      t[i + j] += a[i] * b[j];

  for (size_t i = 0; i < 15; i++)
    t[i] += 38 * t[i + 16];

  for (size_t i = 0; i < 16; i++)
    o[i] = t[i];

  car25519(o);
  car25519(o);
}